

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O3

int XLearnCreate(char *model_type,XL *out)

{
  XLearn *this;
  allocator local_39;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  this = (XLearn *)operator_new(0x4b8);
  XLearn::XLearn(this);
  std::__cxx11::string::string((string *)local_38,model_type,&local_39);
  std::__cxx11::string::operator=((string *)&(this->hyper_param).score_func,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  *out = this;
  return 0;
}

Assistant:

XL_DLL int XLearnCreate(const char *model_type, XL *out) {
  API_BEGIN();
  XLearn* xl = new XLearn;
  xl->GetHyperParam().score_func = std::string(model_type);
  *out = xl;
  API_END();
}